

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_ehlo_resp(Curl_easy *data,connectdata *conn,int smtpcode,smtpstate instate)

{
  _Bool _Var1;
  unsigned_short uVar2;
  int iVar3;
  bool bVar4;
  ulong uStack_50;
  unsigned_short mechbit;
  size_t wordlen;
  size_t llen;
  size_t len;
  char *line;
  smtp_conn *smtpc;
  smtpstate local_20;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  smtpc._4_4_ = CURLE_OK;
  line = (char *)&conn->proto;
  local_20 = instate;
  result = smtpcode;
  _instate_local = conn;
  conn_local = (connectdata *)data;
  len = (size_t)Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
  llen = *(size_t *)(line + 0x88);
  if (((int)result / 100 == 2) || (result == CURLE_UNSUPPORTED_PROTOCOL)) {
    if (llen < 4) {
      Curl_failf((Curl_easy *)conn_local,"Unexpectedly short EHLO response",
                 (long)(int)result % 100 & 0xffffffff);
      smtpc._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
    else {
      len = len + 4;
      llen = llen - 4;
      if ((llen < 8) || (*(long *)len != 0x534c545452415453)) {
        if ((llen < 4) || ((int)*(long *)len != 0x455a4953)) {
          if ((llen < 8) || (*(long *)len != 0x3846545550544d53)) {
            if ((4 < llen) && (iVar3 = memcmp((void *)len,"AUTH ",5), iVar3 == 0)) {
              line[0xd0] = line[0xd0] & 0xefU | 0x10;
              len = len + 5;
              llen = llen - 5;
              while( true ) {
                while( true ) {
                  bVar4 = false;
                  if ((((llen != 0) && (bVar4 = true, *(char *)len != ' ')) &&
                      (bVar4 = true, *(char *)len != '\t')) && (bVar4 = true, *(char *)len != '\r'))
                  {
                    bVar4 = *(char *)len == '\n';
                  }
                  if (!bVar4) break;
                  len = len + 1;
                  llen = llen - 1;
                }
                if (llen == 0) break;
                uStack_50 = 0;
                while( true ) {
                  bVar4 = false;
                  if (((uStack_50 < llen) && (bVar4 = false, *(char *)(len + uStack_50) != ' ')) &&
                     ((bVar4 = false, *(char *)(len + uStack_50) != '\t' &&
                      (bVar4 = false, *(char *)(len + uStack_50) != '\r')))) {
                    bVar4 = *(char *)(len + uStack_50) != '\n';
                  }
                  if (!bVar4) break;
                  uStack_50 = uStack_50 + 1;
                }
                uVar2 = Curl_sasl_decode_mech((char *)len,uStack_50,&wordlen);
                if ((uVar2 != 0) && (wordlen == uStack_50)) {
                  *(ushort *)(line + 0xb8) = *(ushort *)(line + 0xb8) | uVar2;
                }
                len = uStack_50 + len;
                llen = llen - uStack_50;
              }
            }
          }
          else {
            line[0xd0] = line[0xd0] & 0xf7U | 8;
          }
        }
        else {
          line[0xd0] = line[0xd0] & 0xfbU | 4;
        }
      }
      else {
        line[0xd0] = line[0xd0] & 0xfdU | 2;
      }
      if (result != CURLE_UNSUPPORTED_PROTOCOL) {
        if ((*(char *)((long)&conn_local[1].proto + 0xd0) == '\0') ||
           (_Var1 = Curl_conn_is_ssl(_instate_local,0), _Var1)) {
          smtpc._4_4_ = smtp_perform_authentication((Curl_easy *)conn_local);
        }
        else if (((byte)line[0xd0] >> 1 & 1) == 0) {
          if (*(char *)((long)&conn_local[1].proto + 0xd0) == '\x01') {
            smtpc._4_4_ = smtp_perform_authentication((Curl_easy *)conn_local);
          }
          else {
            Curl_failf((Curl_easy *)conn_local,"STARTTLS not supported.");
            smtpc._4_4_ = CURLE_USE_SSL_FAILED;
          }
        }
        else {
          smtpc._4_4_ = smtp_perform_starttls((Curl_easy *)conn_local,_instate_local);
        }
      }
    }
  }
  else if ((*(byte *)((long)&conn_local[1].proto + 0xd0) < 2) ||
          (_Var1 = Curl_conn_is_ssl(_instate_local,0), _Var1)) {
    smtpc._4_4_ = smtp_perform_helo((Curl_easy *)conn_local,_instate_local);
  }
  else {
    Curl_failf((Curl_easy *)conn_local,"Remote access denied: %d",(ulong)result);
    smtpc._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_state_ehlo_resp(struct Curl_easy *data,
                                     struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *line = Curl_dyn_ptr(&smtpc->pp.recvbuf);
  size_t len = smtpc->pp.nfinal;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2 && smtpcode != 1) {
    if(data->set.use_ssl <= CURLUSESSL_TRY
       || Curl_conn_is_ssl(conn, FIRSTSOCKET))
      result = smtp_perform_helo(data, conn);
    else {
      failf(data, "Remote access denied: %d", smtpcode);
      result = CURLE_REMOTE_ACCESS_DENIED;
    }
  }
  else if(len >= 4) {
    line += 4;
    len -= 4;

    /* Does the server support the STARTTLS capability? */
    if(len >= 8 && !memcmp(line, "STARTTLS", 8))
      smtpc->tls_supported = TRUE;

    /* Does the server support the SIZE capability? */
    else if(len >= 4 && !memcmp(line, "SIZE", 4))
      smtpc->size_supported = TRUE;

    /* Does the server support the UTF-8 capability? */
    else if(len >= 8 && !memcmp(line, "SMTPUTF8", 8))
      smtpc->utf8_supported = TRUE;

    /* Does the server support authentication? */
    else if(len >= 5 && !memcmp(line, "AUTH ", 5)) {
      smtpc->auth_supported = TRUE;

      /* Advance past the AUTH keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        size_t llen;
        size_t wordlen;
        unsigned short mechbit;

        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        mechbit = Curl_sasl_decode_mech(line, wordlen, &llen);
        if(mechbit && llen == wordlen)
          smtpc->sasl.authmechs |= mechbit;

        line += wordlen;
        len -= wordlen;
      }
    }

    if(smtpcode != 1) {
      if(data->set.use_ssl && !Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
        /* We do not have a SSL/TLS connection yet, but SSL is requested */
        if(smtpc->tls_supported)
          /* Switch to TLS connection now */
          result = smtp_perform_starttls(data, conn);
        else if(data->set.use_ssl == CURLUSESSL_TRY)
          /* Fallback and carry on with authentication */
          result = smtp_perform_authentication(data);
        else {
          failf(data, "STARTTLS not supported.");
          result = CURLE_USE_SSL_FAILED;
        }
      }
      else
        result = smtp_perform_authentication(data);
    }
  }
  else {
    failf(data, "Unexpectedly short EHLO response");
    result = CURLE_WEIRD_SERVER_REPLY;
  }

  return result;
}